

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnOut.cpp
# Opt level: O0

void __thiscall NaPetriCnOutput::describe(NaPetriCnOutput *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  NaPetriNode *pNVar8;
  undefined4 extraout_var;
  NaPetriConnector *in_RDI;
  
  pcVar6 = "";
  if ((in_RDI[1].pcaLinked.nItems & 1) != 0) {
    pcVar6 = " << STARTER >>";
  }
  pcVar7 = NaPetriConnector::name(in_RDI);
  NaPrintLog("output%s connector \'%s\': ",pcVar6,pcVar7);
  pNVar8 = NaPetriConnector::host(in_RDI);
  if (pNVar8 == (NaPetriNode *)0x0) {
    NaPrintLog("no host node\n");
  }
  else {
    uVar3 = (*in_RDI->_vptr_NaPetriConnector[2])();
    uVar1 = *(uint *)((long)&in_RDI[1]._vptr_NaPetriConnector + 4);
    uVar2 = *(uint *)&in_RDI[1]._vptr_NaPetriConnector;
    iVar4 = (*in_RDI->_vptr_NaPetriConnector[8])();
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x30))();
    NaPrintLog("links=%u  pr.cnt=%u  data_id=%d  data_dim=%u\n",(ulong)uVar3,(ulong)uVar1,
               (ulong)uVar2,(ulong)uVar5);
  }
  return;
}

Assistant:

void
NaPetriCnOutput::describe ()
{
    NaPrintLog("output%s connector '%s': ",
	       bStarter?" << STARTER >>": "", name());
    if(NULL == host()){
        NaPrintLog("no host node\n");
    //}else if(0 == links()){
    //    NaPrintLog("no links\n");
    }else{
        NaPrintLog("links=%u  pr.cnt=%u  data_id=%d  data_dim=%u\n",
                   links(), nPrCnt, idData, data().dim());
    }
}